

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_file_system.cpp
# Opt level: O3

void __thiscall
duckdb::ZstdStreamWrapper::Write
          (ZstdStreamWrapper *this,CompressedFile *file,StreamData *sd,data_ptr_t uncompressed_data,
          int64_t uncompressed_size)

{
  bool bVar1;
  size_t sVar2;
  uint uVar3;
  size_t sVar4;
  _Head_base<0UL,_unsigned_char_*,_false> _Var5;
  pointer this_00;
  IOException *this_01;
  char *pcVar6;
  _Head_base<0UL,_unsigned_char_*,_false> _Var7;
  ZSTD_outBuffer out_buffer;
  ZSTD_inBuffer in_buffer;
  allocator local_89;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *local_88;
  ZSTD_outBuffer local_80;
  ZSTD_inBuffer local_68;
  string local_50;
  
  if (0 < uncompressed_size) {
    local_88 = &file->child_handle;
    _Var7._M_head_impl =
         (sd->out_buff).super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>.
         _M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    _Var5._M_head_impl = sd->out_buff_start;
    do {
      local_80.size = (size_t)(_Var7._M_head_impl + (sd->out_buf_size - (long)_Var5._M_head_impl));
      local_68.pos = 0;
      local_80.pos = 0;
      local_80.dst = _Var5._M_head_impl;
      local_68.src = uncompressed_data;
      local_68.size = uncompressed_size;
      sVar4 = duckdb_zstd::ZSTD_compressStream2
                        (this->zstd_compress_ptr,&local_80,&local_68,ZSTD_e_continue);
      uVar3 = duckdb_zstd::ZSTD_isError(sVar4);
      sVar2 = local_68.pos;
      if (uVar3 != 0) {
        this_01 = (IOException *)__cxa_allocate_exception(0x10);
        pcVar6 = duckdb_zstd::ZSTD_getErrorName(sVar4);
        ::std::__cxx11::string::string((string *)&local_50,pcVar6,&local_89);
        IOException::IOException(this_01,&local_50);
        __cxa_throw(this_01,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      _Var7._M_head_impl =
           (sd->out_buff).super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>.
           _M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      _Var5._M_head_impl = sd->out_buff_start + local_80.pos;
      sd->out_buff_start = _Var5._M_head_impl;
      if (_Var5._M_head_impl == _Var7._M_head_impl + sd->out_buf_size) {
        this_00 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
                  operator->(local_88);
        _Var7._M_head_impl =
             (sd->out_buff).super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
             ._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        FileHandle::Write(this_00,_Var7._M_head_impl,
                          (long)sd->out_buff_start - (long)_Var7._M_head_impl);
        _Var5._M_head_impl =
             (sd->out_buff).super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
             ._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        sd->out_buff_start = _Var5._M_head_impl;
        _Var7._M_head_impl = _Var5._M_head_impl;
      }
      uncompressed_data = uncompressed_data + sVar2;
      sVar4 = uncompressed_size - sVar2;
      bVar1 = (long)sVar2 <= uncompressed_size;
      uncompressed_size = sVar4;
    } while (sVar4 != 0 && bVar1);
  }
  return;
}

Assistant:

void ZstdStreamWrapper::Write(CompressedFile &file, StreamData &sd, data_ptr_t uncompressed_data,
                              int64_t uncompressed_size) {
	D_ASSERT(writing);

	auto remaining = uncompressed_size;
	while (remaining > 0) {
		D_ASSERT(sd.out_buff.get() + sd.out_buf_size > sd.out_buff_start);
		idx_t output_remaining = (sd.out_buff.get() + sd.out_buf_size) - sd.out_buff_start;

		duckdb_zstd::ZSTD_inBuffer in_buffer;
		duckdb_zstd::ZSTD_outBuffer out_buffer;

		in_buffer.src = uncompressed_data;
		in_buffer.size = remaining;
		in_buffer.pos = 0;

		out_buffer.dst = sd.out_buff_start;
		out_buffer.size = output_remaining;
		out_buffer.pos = 0;
		auto res =
		    duckdb_zstd::ZSTD_compressStream2(zstd_compress_ptr, &out_buffer, &in_buffer, duckdb_zstd::ZSTD_e_continue);
		if (duckdb_zstd::ZSTD_isError(res)) {
			throw IOException(duckdb_zstd::ZSTD_getErrorName(res));
		}
		idx_t input_consumed = in_buffer.pos;
		idx_t written_to_output = out_buffer.pos;
		sd.out_buff_start += written_to_output;
		if (sd.out_buff_start == sd.out_buff.get() + sd.out_buf_size) {
			// no more output buffer available: flush
			file.child_handle->Write(sd.out_buff.get(), sd.out_buff_start - sd.out_buff.get());
			sd.out_buff_start = sd.out_buff.get();
		}
		uncompressed_data += input_consumed;
		remaining -= UnsafeNumericCast<int64_t>(input_consumed);
	}
}